

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O0

int Sim_UtilCountAllPairs(Vec_Ptr_t *vSuppFun,int nSimWords,Vec_Int_t *vCounters)

{
  int iVar1;
  uint *pSimInfo;
  undefined4 local_38;
  int i;
  int nPairs;
  int nOnes;
  int Counter;
  uint *pSupp;
  Vec_Int_t *vCounters_local;
  int nSimWords_local;
  Vec_Ptr_t *vSuppFun_local;
  
  nPairs = 0;
  for (local_38 = 0; iVar1 = Vec_PtrSize(vSuppFun), local_38 < iVar1; local_38 = local_38 + 1) {
    pSimInfo = (uint *)Vec_PtrEntry(vSuppFun,local_38);
    iVar1 = Sim_UtilCountOnes(pSimInfo,nSimWords);
    iVar1 = (iVar1 * (iVar1 + -1)) / 2;
    Vec_IntWriteEntry(vCounters,local_38,iVar1);
    nPairs = iVar1 + nPairs;
  }
  return nPairs;
}

Assistant:

int Sim_UtilCountAllPairs( Vec_Ptr_t * vSuppFun, int nSimWords, Vec_Int_t * vCounters )
{
    unsigned * pSupp;
    int Counter, nOnes, nPairs, i;
    Counter = 0;
    Vec_PtrForEachEntry( unsigned *, vSuppFun, pSupp, i )
    {
        nOnes  = Sim_UtilCountOnes( pSupp, nSimWords );
        nPairs = nOnes * (nOnes - 1) / 2;
        Vec_IntWriteEntry( vCounters, i, nPairs );
        Counter += nPairs;
    }
    return Counter;
}